

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreeOpen(sqlite3_vfs *pVfs,char *zFilename,sqlite3 *db,Btree **ppBtree,int flags,
                    int vfsFlags)

{
  char cVar1;
  PCache *pPVar2;
  sqlite3_pcache *psVar3;
  sqlite3_file *psVar4;
  sqlite3_io_methods *psVar5;
  byte bVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  Btree *p;
  BtShared *__s;
  Btree *pBVar11;
  char *pcVar12;
  BtShared *__dest;
  long lVar13;
  Btree *pBVar14;
  void *pvVar15;
  long lVar16;
  Pager *pPVar17;
  sqlite3_mutex *psVar18;
  sqlite3_mutex *psVar19;
  Btree **ppBVar20;
  code *pcVar21;
  uint uVar22;
  long lVar23;
  Btree *pBVar24;
  byte bVar25;
  uint uVar26;
  int iVar27;
  char *pcVar28;
  char *pcVar29;
  u8 uVar30;
  uint uVar31;
  BtShared *pBVar32;
  size_t sVar33;
  bool bVar34;
  uchar zDbHeader [100];
  sqlite3_mutex *local_f0;
  u8 local_d0;
  uint local_9c;
  uint local_98 [4];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  ulong local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  
  if (zFilename == (char *)0x0) {
    bVar34 = true;
LAB_001584e8:
    if ((!bVar34) || (bVar6 = 1, db->temp_store != '\x02')) {
      bVar6 = (byte)vfsFlags >> 7;
    }
  }
  else {
    bVar34 = *zFilename == '\0';
    iVar7 = strcmp(zFilename,":memory:");
    if (iVar7 != 0) goto LAB_001584e8;
    bVar6 = 1;
  }
  uVar10 = flags | 2;
  if (bVar6 == 0) {
    uVar10 = flags;
  }
  uVar26 = vfsFlags & 0xfffffcffU | 0x200;
  if (bVar6 == 0 && !bVar34) {
    uVar26 = vfsFlags;
  }
  if ((vfsFlags & 0x100U) == 0) {
    uVar26 = vfsFlags;
  }
  p = (Btree *)sqlite3Malloc(0x48);
  if (p == (Btree *)0x0) {
    return 7;
  }
  p->db = (sqlite3 *)0x0;
  p->pBt = (BtShared *)0x0;
  (p->lock).pBtree = (Btree *)0x0;
  (p->lock).iTable = 0;
  (p->lock).eLock = '\0';
  *(undefined3 *)&(p->lock).field_0xd = 0;
  p->pNext = (Btree *)0x0;
  p->pPrev = (Btree *)0x0;
  p->inTrans = '\0';
  p->sharable = '\0';
  p->locked = '\0';
  p->field_0x13 = 0;
  p->wantToLock = 0;
  *(undefined8 *)&p->nBackup = 0;
  (p->lock).pNext = (BtLock *)0x0;
  p->db = db;
  (p->lock).pBtree = p;
  (p->lock).iTable = 1;
  if ((!bVar34) && ((uVar26 >> 0x11 & 1) != 0 && ((uVar26 & 0x40) == 0 & bVar6) == 0)) {
    iVar7 = pVfs->mxPathname + 1;
    pBVar11 = (Btree *)sqlite3Malloc(iVar7);
    p->sharable = '\x01';
    if (pBVar11 != (Btree *)0x0) {
      if (bVar6 == 0) {
        *(undefined1 *)&pBVar11->db = 0;
        iVar7 = (*pVfs->xFullPathname)(pVfs,zFilename,iVar7,(char *)pBVar11);
        if (iVar7 != 0) {
          sqlite3_free(pBVar11);
          bVar34 = false;
          local_f0 = (sqlite3_mutex *)0x0;
          __s = (BtShared *)0x0;
          pBVar11 = p;
          iVar9 = iVar7;
          goto LAB_0015919f;
        }
      }
      else {
        if (zFilename == (char *)0x0) {
          sVar33 = 1;
        }
        else {
          lVar23 = -1;
          do {
            lVar13 = lVar23 + 1;
            lVar23 = lVar23 + 1;
          } while (zFilename[lVar13] != '\0');
          sVar33 = (ulong)((uint)lVar23 & 0x3fffffff) + 1;
        }
        memcpy(pBVar11,zFilename,sVar33);
      }
      if (sqlite3Config.bCoreMutex == 0) {
        local_f0 = (sqlite3_mutex *)0x0;
      }
      else {
        local_f0 = (*sqlite3Config.mutex.xMutexAlloc)(4);
      }
      if (local_f0 != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexEnter)(local_f0);
      }
      if (sqlite3Config.bCoreMutex == 0) {
        psVar18 = (sqlite3_mutex *)0x0;
      }
      else {
        psVar18 = (*sqlite3Config.mutex.xMutexAlloc)(2);
      }
      __s = sqlite3SharedCacheList;
      if (psVar18 != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexEnter)(psVar18);
        __s = sqlite3SharedCacheList;
      }
      for (; __s != (BtShared *)0x0; __s = __s->pNext) {
        pPVar17 = __s->pPager;
        iVar7 = strcmp((char *)pBVar11,pPVar17->zFilename);
        if ((iVar7 == 0) && (pPVar17->pVfs == pVfs)) {
          lVar23 = (long)db->nDb;
          bVar34 = lVar23 < 1;
          if (lVar23 < 1) goto LAB_00158b70;
          ppBVar20 = &db->aDb[lVar23 + -1].pBt;
          lVar23 = lVar23 + 1;
          goto LAB_00158b4d;
        }
      }
      goto LAB_00159180;
    }
    iVar9 = 7;
    iVar7 = 0;
    bVar34 = false;
    local_f0 = (sqlite3_mutex *)0x0;
    __s = (BtShared *)0x0;
    pBVar11 = p;
    goto LAB_0015919f;
  }
  iVar7 = 0;
  local_f0 = (sqlite3_mutex *)0x0;
  __s = (BtShared *)0x0;
  goto LAB_0015859f;
LAB_001585f5:
  do {
    pBVar14 = pBVar11;
    pBVar11 = pBVar14->pPrev;
  } while (pBVar14->pPrev != (Btree *)0x0);
  if (p->pBt < pBVar14->pBt) {
    p->pNext = pBVar14;
    ppBVar20 = &pBVar14->pPrev;
    p->pPrev = (Btree *)0x0;
  }
  else {
    do {
      pBVar11 = pBVar14;
      pBVar14 = pBVar11->pNext;
      if (pBVar14 == (Btree *)0x0) {
        p->pNext = (Btree *)0x0;
        pBVar14 = p;
        pBVar24 = pBVar11;
        goto LAB_00158a88;
      }
    } while (pBVar14->pBt < p->pBt);
    p->pNext = pBVar14;
    p->pPrev = pBVar11;
    pBVar24 = p;
    if (pBVar14 != (Btree *)0x0) {
LAB_00158a88:
      pBVar14->pPrev = pBVar24;
    }
    ppBVar20 = &pBVar11->pNext;
  }
  *ppBVar20 = p;
  goto LAB_00158a93;
  while( true ) {
    lVar16 = lVar23 + -1;
    ppBVar20 = ppBVar20 + -4;
    lVar13 = lVar23 + -3;
    bVar34 = lVar16 < 2;
    lVar23 = lVar16;
    if (SBORROW8(lVar16,2) != lVar13 < 0) break;
LAB_00158b4d:
    if ((*ppBVar20 != (Btree *)0x0) && ((*ppBVar20)->pBt == __s)) {
      if (psVar18 != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexLeave)(psVar18);
      }
      if (local_f0 != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexLeave)(local_f0);
      }
      sqlite3_free(pBVar11);
      sqlite3_free(p);
      goto LAB_0015917a;
    }
  }
LAB_00158b70:
  p->pBt = __s;
  __s->nRef = __s->nRef + 1;
LAB_0015917a:
  if (bVar34) {
LAB_00159180:
    bVar34 = true;
    iVar7 = 0;
    iVar9 = 0x13;
    if (psVar18 != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(psVar18);
    }
LAB_0015919f:
    sqlite3_free(pBVar11);
  }
  else {
    iVar9 = 0x13;
    iVar7 = 0;
    bVar34 = false;
  }
  if (!bVar34) {
    return iVar9;
  }
LAB_0015859f:
  if (__s == (BtShared *)0x0) {
    __s = (BtShared *)sqlite3Malloc(0x88);
    uVar31 = 0;
    if (__s == (BtShared *)0x0) {
      iVar7 = 7;
      __s = (BtShared *)0x0;
      goto LAB_00158a97;
    }
    memset(__s,0,0x88);
    local_98[0] = 0x400;
    uVar22 = 0x30;
    if (0x30 < pVfs->szOsFile) {
      uVar22 = pVfs->szOsFile + 7U & 0xfffffff8;
    }
    __s->pPager = (Pager *)0x0;
    uVar8 = uVar10 & 2;
    pcVar12 = zFilename;
    pBVar32 = __s;
    if (uVar8 == 0) {
      local_d0 = '\0';
      __dest = (BtShared *)0x0;
LAB_0015890c:
      iVar7 = (int)pBVar32;
      if ((pcVar12 == (char *)0x0) || (*pcVar12 == '\0')) {
        pcVar29 = (char *)0x0;
        iVar27 = 0;
        iVar9 = 0;
LAB_00158b8e:
        iVar7 = iVar9;
        iVar9 = (pVfs->szOsFile + 7U & 0xfffffff8) + uVar31 * 3 + uVar22 * 2 + iVar27 + 0x189;
        pPVar17 = (Pager *)sqlite3Malloc(iVar9);
        if (pPVar17 == (Pager *)0x0) {
          sqlite3_free(__dest);
          goto LAB_00158daa;
        }
        memset(pPVar17,0,(long)iVar9);
        pPVar17->pPCache = (PCache *)(pPVar17 + 1);
        pPVar17->fd = (sqlite3_file *)&pPVar17[1].jfd;
        pcVar28 = pPVar17[1].dbFileVers + (((long)pVfs->szOsFile + 7U & 0xfffffffffffffff8) - 0x34);
        pPVar17->sjfd = (sqlite3_file *)pcVar28;
        pPVar17->jfd = (sqlite3_file *)(pcVar28 + (int)uVar22);
        pcVar28 = pcVar28 + (int)uVar22 + (int)uVar22;
        pPVar17->zFilename = pcVar28;
        if (__dest != (BtShared *)0x0) {
          sVar33 = (size_t)(int)uVar31;
          pPVar17->zJournal = pcVar28 + (int)(uVar31 + iVar27 + 1);
          memcpy(pcVar28,__dest,sVar33);
          if (iVar27 != 0) {
            memcpy(pPVar17->zFilename + (int)(uVar31 + 1),pcVar29,(long)iVar27);
          }
          memcpy(pPVar17->zJournal,__dest,sVar33);
          builtin_strncpy(pPVar17->zJournal + sVar33,"-journal",9);
          (pPVar17->zJournal + sVar33 + 8)[1] = '\0';
          pPVar17->zWal = pPVar17->zJournal + sVar33 + 9;
          memcpy(pPVar17->zJournal + sVar33 + 9,__dest,sVar33);
          builtin_strncpy(pPVar17->zWal + sVar33,"-wal",5);
          sqlite3_free(__dest);
        }
        pPVar17->pVfs = pVfs;
        pPVar17->vfsFlags = uVar26;
        if ((pcVar12 == (char *)0x0) || (*pcVar12 == '\0')) {
          pPVar17->eState = '\x01';
          pPVar17->eLock = '\x04';
          bVar25 = (byte)uVar26 & 1;
          uVar30 = '\x01';
          bVar34 = false;
        }
        else {
          local_9c = 0;
          iVar7 = (*pVfs->xOpen)(pVfs,pPVar17->zFilename,pPVar17->fd,uVar26 & 0x87f7f,
                                 (int *)&local_9c);
          bVar25 = (byte)(local_9c & 1);
          if (iVar7 == 0 && (local_9c & 1) == 0) {
            setSectorSize(pPVar17);
            uVar26 = pPVar17->sectorSize;
            if (local_98[0] < uVar26) {
              if (uVar26 < 0x2001) {
                local_98[0] = uVar26;
              }
              else {
                local_98[0] = 0x2000;
              }
            }
          }
          bVar34 = true;
          uVar30 = '\0';
        }
        if (iVar7 == 0) {
          iVar7 = sqlite3PagerSetPagesize(pPVar17,local_98,-1);
        }
        if (iVar7 == 0) {
          pcVar21 = (_func_int_void_ptr_PgHdr_ptr *)0x0;
          if (uVar8 == 0) {
            pcVar21 = pagerStress;
          }
          pPVar2 = pPVar17->pPCache;
          pPVar2->szPage = 0;
          pPVar2->szExtra = 0;
          *(undefined8 *)&pPVar2->bPurgeable = 0;
          pPVar2->xStress = (_func_int_void_ptr_PgHdr_ptr *)0x0;
          pPVar2->pStress = (void *)0x0;
          pPVar2->pSynced = (PgHdr *)0x0;
          pPVar2->nRef = 0;
          pPVar2->szCache = 0;
          pPVar2->pCache = (sqlite3_pcache *)0x0;
          pPVar2->pPage1 = (PgHdr *)0x0;
          pPVar2->pDirty = (PgHdr *)0x0;
          pPVar2->pDirtyTail = (PgHdr *)0x0;
          pPVar2->szPage = local_98[0];
          pPVar2->szExtra = 0x78;
          pPVar2->bPurgeable = uVar8 >> 1 ^ 1;
          pPVar2->xStress = pcVar21;
          pPVar2->pStress = pPVar17;
          pPVar2->szCache = 100;
          pPVar17->useJournal = (byte)(uVar10 & 1) ^ 1;
          pPVar17->mxPgno = 0x3fffffff;
          pPVar17->tempFile = uVar30;
          pPVar17->exclusiveMode = uVar30;
          pPVar17->changeCountDone = uVar30;
          pPVar17->memDb = local_d0;
          pPVar17->readOnly = bVar25;
          pPVar17->noSync = uVar30;
          if (bVar34) {
            pPVar17->fullSync = '\x01';
            pPVar17->ckptSyncFlags = '\x02';
            pPVar17->walSyncFlags = '\"';
            pPVar17->syncFlags = '\x02';
          }
          pPVar17->nExtra = 0x78;
          pPVar17->journalSizeLimit = -1;
          setSectorSize(pPVar17);
          if ((uVar10 & 3) != 0) {
            pPVar17->journalMode = ((uVar10 & 1) == 0) * '\x02' + '\x02';
          }
          pPVar17->xReiniter = pageReinit;
          __s->pPager = pPVar17;
          iVar7 = 0;
        }
        else {
          psVar4 = pPVar17->fd;
          if (psVar4->pMethods != (sqlite3_io_methods *)0x0) {
            (*psVar4->pMethods->xClose)(psVar4);
            psVar4->pMethods = (sqlite3_io_methods *)0x0;
          }
          sqlite3_free(pPVar17);
        }
      }
      else {
        uVar31 = pVfs->mxPathname + 1;
        __dest = (BtShared *)sqlite3Malloc(pVfs->mxPathname * 2 + 2);
        if (__dest == (BtShared *)0x0) {
          iVar7 = 7;
          iVar9 = 0;
          pcVar29 = (char *)0x0;
          iVar27 = 0;
LAB_00158a77:
          bVar34 = false;
        }
        else {
          *(undefined1 *)&__dest->pPager = 0;
          iVar9 = (*pVfs->xFullPathname)(pVfs,pcVar12,uVar31,(char *)__dest);
          lVar23 = 0;
          do {
            pcVar29 = (char *)((long)&__dest->pPager + lVar23);
            lVar23 = lVar23 + 1;
          } while (*pcVar29 != '\0');
          lVar13 = -1;
          do {
            lVar16 = lVar13 + 1;
            lVar13 = lVar13 + 1;
          } while (pcVar12[lVar16] != '\0');
          pcVar29 = pcVar12 + (ulong)((uint)lVar13 & 0x3fffffff) + 1;
          cVar1 = *pcVar29;
          pcVar28 = pcVar29;
          while (cVar1 != '\0') {
            lVar13 = -1;
            do {
              lVar16 = lVar13 + 1;
              lVar13 = lVar13 + 1;
            } while (pcVar28[lVar16] != '\0');
            uVar31 = (uint)lVar13 & 0x3fffffff;
            lVar13 = -1;
            do {
              lVar16 = lVar13 + (ulong)uVar31 + 2;
              lVar13 = lVar13 + 1;
            } while (pcVar28[lVar16] != '\0');
            pcVar28 = pcVar28 + (ulong)((uint)lVar13 & 0x3fffffff) + (ulong)uVar31 + 2;
            cVar1 = *pcVar28;
          }
          uVar31 = (int)lVar23 - 1U & 0x3fffffff;
          if ((iVar9 == 0) && (iVar9 = 0, pVfs->mxPathname < (int)(uVar31 + 8))) {
            sqlite3_log(0xe,"cannot open file at line %d of [%.10s]",0xa79a);
            iVar9 = 0xe;
          }
          iVar27 = ((int)pcVar28 - (int)pcVar29) + 1;
          if (iVar9 != 0) {
            sqlite3_free(__dest);
            iVar7 = iVar9;
            goto LAB_00158a77;
          }
          bVar34 = true;
          iVar9 = 0;
        }
        if (bVar34) goto LAB_00158b8e;
      }
    }
    else {
      if (zFilename == (char *)0x0) {
        local_d0 = '\x01';
        __dest = (BtShared *)0x0;
        uVar31 = 0;
        pcVar12 = (char *)0x0;
        goto LAB_0015890c;
      }
      if (*zFilename == '\0') {
        local_d0 = '\x01';
        __dest = (BtShared *)0x0;
        uVar31 = 0;
        goto LAB_0015890c;
      }
      lVar23 = 0;
      do {
        pcVar12 = zFilename + lVar23;
        lVar23 = lVar23 + 1;
      } while (*pcVar12 != '\0');
      uVar31 = ((int)lVar23 - 1U & 0x3fffffff) + 1;
      __dest = (BtShared *)sqlite3Malloc(uVar31);
      if (__dest != (BtShared *)0x0) {
        local_d0 = '\x01';
        memcpy(__dest,zFilename,(ulong)uVar31);
        lVar23 = 0;
        do {
          pcVar12 = (char *)((long)&__dest->pPager + lVar23);
          lVar23 = lVar23 + 1;
        } while (*pcVar12 != '\0');
        uVar31 = (int)lVar23 - 1U & 0x3fffffff;
        pcVar12 = (char *)0x0;
        pBVar32 = __dest;
        goto LAB_0015890c;
      }
LAB_00158daa:
      iVar7 = 7;
    }
    if (iVar7 == 0) {
      pPVar17 = __s->pPager;
      pPVar17->szMmap = db->szMmap;
      pagerFixMaplimit(pPVar17);
      local_48 = 0;
      uStack_40 = 0;
      local_58 = 0;
      uStack_50 = 0;
      local_68 = 0;
      uStack_60 = 0;
      local_78 = 0;
      uStack_70 = 0;
      local_88 = 0;
      uStack_80 = 0;
      local_98[0] = 0;
      local_98[1] = 0;
      local_98[2] = 0;
      local_98[3] = 0;
      local_38 = 0;
      psVar4 = __s->pPager->fd;
      psVar5 = psVar4->pMethods;
      if (psVar5 == (sqlite3_io_methods *)0x0) {
        iVar7 = 0;
      }
      else {
        iVar7 = (*psVar5->xRead)(psVar4,local_98,100,0);
        if (iVar7 == 0x20a) {
          iVar7 = 0;
        }
      }
    }
    if (iVar7 != 0) goto LAB_00158a97;
    __s->openFlags = (u8)uVar10;
    __s->db = db;
    pPVar17 = __s->pPager;
    pPVar17->xBusyHandler = btreeInvokeBusyHandler;
    pPVar17->pBusyHandlerArg = __s;
    psVar5 = pPVar17->fd->pMethods;
    if (psVar5 != (sqlite3_io_methods *)0x0) {
      (*psVar5->xFileControl)(pPVar17->fd,0xf,&pPVar17->xBusyHandler);
    }
    p->pBt = __s;
    __s->pCursor = (BtCursor *)0x0;
    __s->pPage1 = (MemPage *)0x0;
    if (__s->pPager->readOnly != '\0') {
      *(byte *)&__s->btsFlags = (byte)__s->btsFlags | 1;
    }
    iVar7 = (int)((local_88 & 0xff) << 8);
    uVar10 = (uint)local_88._1_1_ * 0x10000 + iVar7;
    __s->pageSize = uVar10;
    if (((iVar7 + (uint)local_88._1_1_ * 0x10000) - 0x10001 < 0xffff01ff) ||
       ((uVar10 + 0x1ffff & uVar10) != 0)) {
      __s->pageSize = 0;
      uVar10 = 0;
      if (zFilename != (char *)0x0 && bVar6 == 0) {
        __s->autoVacuum = '\0';
        __s->incrVacuum = '\0';
        uVar10 = 0;
      }
    }
    else {
      uVar10 = (uint)local_88._4_1_;
      __s->btsFlags = __s->btsFlags | 2;
      __s->autoVacuum =
           ((local_68._4_4_ >> 0x18 != 0 || (local_68 & 0xff000000000000) != 0) ||
           (local_68 & 0xff0000000000) != 0) || (local_68 & 0xff00000000) != 0;
      __s->incrVacuum =
           (((uint)local_58 >> 0x18 != 0 || (local_58 & 0xff0000) != 0) || (local_58 & 0xff00) != 0)
           || (local_58 & 0xff) != 0;
    }
    iVar7 = sqlite3PagerSetPagesize(__s->pPager,&__s->pageSize,uVar10);
    if (iVar7 != 0) goto LAB_00158a97;
    __s->usableSize = __s->pageSize - uVar10;
    if (p->sharable == '\0') {
      iVar7 = 0;
      goto LAB_001585ab;
    }
    __s->nRef = 1;
    if (sqlite3Config.bCoreMutex == 0) {
      psVar18 = (sqlite3_mutex *)0x0;
    }
    else {
      psVar18 = (*sqlite3Config.mutex.xMutexAlloc)(2);
    }
    if (sqlite3Config.bCoreMutex == 0) {
LAB_00159103:
      if (psVar18 == (sqlite3_mutex *)0x0) {
        __s->pNext = sqlite3SharedCacheList;
        sqlite3SharedCacheList = __s;
      }
      else {
        (*sqlite3Config.mutex.xMutexEnter)(psVar18);
        __s->pNext = sqlite3SharedCacheList;
        sqlite3SharedCacheList = __s;
        (*sqlite3Config.mutex.xMutexLeave)(psVar18);
      }
      bVar34 = true;
      iVar7 = 0;
    }
    else {
      psVar19 = (*sqlite3Config.mutex.xMutexAlloc)(0);
      __s->mutex = psVar19;
      if (psVar19 != (sqlite3_mutex *)0x0) goto LAB_00159103;
      db->mallocFailed = '\0';
      iVar7 = 7;
      bVar34 = false;
    }
    if (!bVar34) goto LAB_00158a97;
  }
LAB_001585ab:
  if ((p->sharable != '\0') && (0 < (long)db->nDb)) {
    lVar23 = 0;
    do {
      pBVar11 = *(Btree **)((long)&db->aDb->pBt + lVar23);
      if ((pBVar11 != (Btree *)0x0) && (pBVar11->sharable != '\0')) goto LAB_001585f5;
      lVar23 = lVar23 + 0x20;
    } while ((long)db->nDb * 0x20 != lVar23);
  }
LAB_00158a93:
  *ppBtree = p;
LAB_00158a97:
  if (iVar7 == 0) {
    pvVar15 = sqlite3BtreeSchema(p,0,(_func_void_void_ptr *)0x0);
    if (pvVar15 == (void *)0x0) {
      pPVar2 = p->pBt->pPager->pPCache;
      pPVar2->szCache = 2000;
      psVar3 = pPVar2->pCache;
      if (psVar3 != (sqlite3_pcache *)0x0) {
        (*sqlite3Config.pcache2.xCachesize)(psVar3,2000);
      }
    }
  }
  else {
    if ((__s != (BtShared *)0x0) && (__s->pPager != (Pager *)0x0)) {
      sqlite3PagerClose(__s->pPager);
    }
    sqlite3_free(__s);
    sqlite3_free(p);
    *ppBtree = (Btree *)0x0;
  }
  if (local_f0 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(local_f0);
  }
  return iVar7;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeOpen(
  sqlite3_vfs *pVfs,      /* VFS to use for this b-tree */
  const char *zFilename,  /* Name of the file containing the BTree database */
  sqlite3 *db,            /* Associated database handle */
  Btree **ppBtree,        /* Pointer to new Btree object written here */
  int flags,              /* Options */
  int vfsFlags            /* Flags passed through to sqlite3_vfs.xOpen() */
){
  BtShared *pBt = 0;             /* Shared part of btree structure */
  Btree *p;                      /* Handle to return */
  sqlite3_mutex *mutexOpen = 0;  /* Prevents a race condition. Ticket #3537 */
  int rc = SQLITE_OK;            /* Result code from this function */
  u8 nReserve;                   /* Byte of unused space on each page */
  unsigned char zDbHeader[100];  /* Database header content */

  /* True if opening an ephemeral, temporary database */
  const int isTempDb = zFilename==0 || zFilename[0]==0;

  /* Set the variable isMemdb to true for an in-memory database, or 
  ** false for a file-based database.
  */
#ifdef SQLITE_OMIT_MEMORYDB
  const int isMemdb = 0;
#else
  const int isMemdb = (zFilename && strcmp(zFilename, ":memory:")==0)
                       || (isTempDb && sqlite3TempInMemory(db))
                       || (vfsFlags & SQLITE_OPEN_MEMORY)!=0;
#endif

  assert( db!=0 );
  assert( pVfs!=0 );
  assert( sqlite3_mutex_held(db->mutex) );
  assert( (flags&0xff)==flags );   /* flags fit in 8 bits */

  /* Only a BTREE_SINGLE database can be BTREE_UNORDERED */
  assert( (flags & BTREE_UNORDERED)==0 || (flags & BTREE_SINGLE)!=0 );

  /* A BTREE_SINGLE database is always a temporary and/or ephemeral */
  assert( (flags & BTREE_SINGLE)==0 || isTempDb );

  if( isMemdb ){
    flags |= BTREE_MEMORY;
  }
  if( (vfsFlags & SQLITE_OPEN_MAIN_DB)!=0 && (isMemdb || isTempDb) ){
    vfsFlags = (vfsFlags & ~SQLITE_OPEN_MAIN_DB) | SQLITE_OPEN_TEMP_DB;
  }
  p = sqlite3MallocZero(sizeof(Btree));
  if( !p ){
    return SQLITE_NOMEM;
  }
  p->inTrans = TRANS_NONE;
  p->db = db;
#ifndef SQLITE_OMIT_SHARED_CACHE
  p->lock.pBtree = p;
  p->lock.iTable = 1;
#endif

#if !defined(SQLITE_OMIT_SHARED_CACHE) && !defined(SQLITE_OMIT_DISKIO)
  /*
  ** If this Btree is a candidate for shared cache, try to find an
  ** existing BtShared object that we can share with
  */
  if( isTempDb==0 && (isMemdb==0 || (vfsFlags&SQLITE_OPEN_URI)!=0) ){
    if( vfsFlags & SQLITE_OPEN_SHAREDCACHE ){
      int nFullPathname = pVfs->mxPathname+1;
      char *zFullPathname = sqlite3Malloc(nFullPathname);
      MUTEX_LOGIC( sqlite3_mutex *mutexShared; )
      p->sharable = 1;
      if( !zFullPathname ){
        sqlite3_free(p);
        return SQLITE_NOMEM;
      }
      if( isMemdb ){
        memcpy(zFullPathname, zFilename, sqlite3Strlen30(zFilename)+1);
      }else{
        rc = sqlite3OsFullPathname(pVfs, zFilename,
                                   nFullPathname, zFullPathname);
        if( rc ){
          sqlite3_free(zFullPathname);
          sqlite3_free(p);
          return rc;
        }
      }
#if SQLITE_THREADSAFE
      mutexOpen = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_OPEN);
      sqlite3_mutex_enter(mutexOpen);
      mutexShared = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MASTER);
      sqlite3_mutex_enter(mutexShared);
#endif
      for(pBt=GLOBAL(BtShared*,sqlite3SharedCacheList); pBt; pBt=pBt->pNext){
        assert( pBt->nRef>0 );
        if( 0==strcmp(zFullPathname, sqlite3PagerFilename(pBt->pPager, 0))
                 && sqlite3PagerVfs(pBt->pPager)==pVfs ){
          int iDb;
          for(iDb=db->nDb-1; iDb>=0; iDb--){
            Btree *pExisting = db->aDb[iDb].pBt;
            if( pExisting && pExisting->pBt==pBt ){
              sqlite3_mutex_leave(mutexShared);
              sqlite3_mutex_leave(mutexOpen);
              sqlite3_free(zFullPathname);
              sqlite3_free(p);
              return SQLITE_CONSTRAINT;
            }
          }
          p->pBt = pBt;
          pBt->nRef++;
          break;
        }
      }
      sqlite3_mutex_leave(mutexShared);
      sqlite3_free(zFullPathname);
    }
#ifdef SQLITE_DEBUG
    else{
      /* In debug mode, we mark all persistent databases as sharable
      ** even when they are not.  This exercises the locking code and
      ** gives more opportunity for asserts(sqlite3_mutex_held())
      ** statements to find locking problems.
      */
      p->sharable = 1;
    }
#endif
  }
#endif
  if( pBt==0 ){
    /*
    ** The following asserts make sure that structures used by the btree are
    ** the right size.  This is to guard against size changes that result
    ** when compiling on a different architecture.
    */
    assert( sizeof(i64)==8 || sizeof(i64)==4 );
    assert( sizeof(u64)==8 || sizeof(u64)==4 );
    assert( sizeof(u32)==4 );
    assert( sizeof(u16)==2 );
    assert( sizeof(Pgno)==4 );
  
    pBt = sqlite3MallocZero( sizeof(*pBt) );
    if( pBt==0 ){
      rc = SQLITE_NOMEM;
      goto btree_open_out;
    }
    rc = sqlite3PagerOpen(pVfs, &pBt->pPager, zFilename,
                          EXTRA_SIZE, flags, vfsFlags, pageReinit);
    if( rc==SQLITE_OK ){
      sqlite3PagerSetMmapLimit(pBt->pPager, db->szMmap);
      rc = sqlite3PagerReadFileheader(pBt->pPager,sizeof(zDbHeader),zDbHeader);
    }
    if( rc!=SQLITE_OK ){
      goto btree_open_out;
    }
    pBt->openFlags = (u8)flags;
    pBt->db = db;
    sqlite3PagerSetBusyhandler(pBt->pPager, btreeInvokeBusyHandler, pBt);
    p->pBt = pBt;
  
    pBt->pCursor = 0;
    pBt->pPage1 = 0;
    if( sqlite3PagerIsreadonly(pBt->pPager) ) pBt->btsFlags |= BTS_READ_ONLY;
#ifdef SQLITE_SECURE_DELETE
    pBt->btsFlags |= BTS_SECURE_DELETE;
#endif
    pBt->pageSize = (zDbHeader[16]<<8) | (zDbHeader[17]<<16);
    if( pBt->pageSize<512 || pBt->pageSize>SQLITE_MAX_PAGE_SIZE
         || ((pBt->pageSize-1)&pBt->pageSize)!=0 ){
      pBt->pageSize = 0;
#ifndef SQLITE_OMIT_AUTOVACUUM
      /* If the magic name ":memory:" will create an in-memory database, then
      ** leave the autoVacuum mode at 0 (do not auto-vacuum), even if
      ** SQLITE_DEFAULT_AUTOVACUUM is true. On the other hand, if
      ** SQLITE_OMIT_MEMORYDB has been defined, then ":memory:" is just a
      ** regular file-name. In this case the auto-vacuum applies as per normal.
      */
      if( zFilename && !isMemdb ){
        pBt->autoVacuum = (SQLITE_DEFAULT_AUTOVACUUM ? 1 : 0);
        pBt->incrVacuum = (SQLITE_DEFAULT_AUTOVACUUM==2 ? 1 : 0);
      }
#endif
      nReserve = 0;
    }else{
      nReserve = zDbHeader[20];
      pBt->btsFlags |= BTS_PAGESIZE_FIXED;
#ifndef SQLITE_OMIT_AUTOVACUUM
      pBt->autoVacuum = (get4byte(&zDbHeader[36 + 4*4])?1:0);
      pBt->incrVacuum = (get4byte(&zDbHeader[36 + 7*4])?1:0);
#endif
    }
    rc = sqlite3PagerSetPagesize(pBt->pPager, &pBt->pageSize, nReserve);
    if( rc ) goto btree_open_out;
    pBt->usableSize = pBt->pageSize - nReserve;
    assert( (pBt->pageSize & 7)==0 );  /* 8-byte alignment of pageSize */
   
#if !defined(SQLITE_OMIT_SHARED_CACHE) && !defined(SQLITE_OMIT_DISKIO)
    /* Add the new BtShared object to the linked list sharable BtShareds.
    */
    if( p->sharable ){
      MUTEX_LOGIC( sqlite3_mutex *mutexShared; )
      pBt->nRef = 1;
      MUTEX_LOGIC( mutexShared = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MASTER);)
      if( SQLITE_THREADSAFE && sqlite3GlobalConfig.bCoreMutex ){
        pBt->mutex = sqlite3MutexAlloc(SQLITE_MUTEX_FAST);
        if( pBt->mutex==0 ){
          rc = SQLITE_NOMEM;
          db->mallocFailed = 0;
          goto btree_open_out;
        }
      }
      sqlite3_mutex_enter(mutexShared);
      pBt->pNext = GLOBAL(BtShared*,sqlite3SharedCacheList);
      GLOBAL(BtShared*,sqlite3SharedCacheList) = pBt;
      sqlite3_mutex_leave(mutexShared);
    }
#endif
  }

#if !defined(SQLITE_OMIT_SHARED_CACHE) && !defined(SQLITE_OMIT_DISKIO)
  /* If the new Btree uses a sharable pBtShared, then link the new
  ** Btree into the list of all sharable Btrees for the same connection.
  ** The list is kept in ascending order by pBt address.
  */
  if( p->sharable ){
    int i;
    Btree *pSib;
    for(i=0; i<db->nDb; i++){
      if( (pSib = db->aDb[i].pBt)!=0 && pSib->sharable ){
        while( pSib->pPrev ){ pSib = pSib->pPrev; }
        if( p->pBt<pSib->pBt ){
          p->pNext = pSib;
          p->pPrev = 0;
          pSib->pPrev = p;
        }else{
          while( pSib->pNext && pSib->pNext->pBt<p->pBt ){
            pSib = pSib->pNext;
          }
          p->pNext = pSib->pNext;
          p->pPrev = pSib;
          if( p->pNext ){
            p->pNext->pPrev = p;
          }
          pSib->pNext = p;
        }
        break;
      }
    }
  }
#endif
  *ppBtree = p;

btree_open_out:
  if( rc!=SQLITE_OK ){
    if( pBt && pBt->pPager ){
      sqlite3PagerClose(pBt->pPager);
    }
    sqlite3_free(pBt);
    sqlite3_free(p);
    *ppBtree = 0;
  }else{
    /* If the B-Tree was successfully opened, set the pager-cache size to the
    ** default value. Except, when opening on an existing shared pager-cache,
    ** do not change the pager-cache size.
    */
    if( sqlite3BtreeSchema(p, 0, 0)==0 ){
      sqlite3PagerSetCachesize(p->pBt->pPager, SQLITE_DEFAULT_CACHE_SIZE);
    }
  }
  if( mutexOpen ){
    assert( sqlite3_mutex_held(mutexOpen) );
    sqlite3_mutex_leave(mutexOpen);
  }
  return rc;
}